

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O1

void Sim_SymmsBalanceCollect_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  
  for (; ((ulong)pNode & 1) == 0;
      pNode = (Abc_Obj_t *)
              ((ulong)(*(uint *)&pNode->field_0x14 >> 0xb & 1) ^
              (ulong)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]])) {
    uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
    if ((uVar2 == 5) || (uVar2 == 2)) {
      uVar2 = vNodes->nSize;
      if (0 < (long)(int)uVar2) {
        lVar4 = 0;
        do {
          if ((Abc_Obj_t *)vNodes->pArray[lVar4] == pNode) {
            return;
          }
          lVar4 = lVar4 + 1;
        } while ((int)uVar2 != lVar4);
      }
      goto LAB_0044f494;
    }
    Sim_SymmsBalanceCollect_rec
              ((Abc_Obj_t *)
               ((ulong)(*(uint *)&pNode->field_0x14 >> 10 & 1) ^
               (ulong)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]),vNodes);
  }
  uVar2 = vNodes->nSize;
  if (0 < (long)(int)uVar2) {
    lVar4 = 0;
    do {
      if ((Abc_Obj_t *)vNodes->pArray[lVar4] == pNode) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while ((int)uVar2 != lVar4);
  }
LAB_0044f494:
  uVar1 = vNodes->nCap;
  if (uVar2 == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar3;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_0044f4fe;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
      }
      vNodes->pArray = ppvVar3;
    }
    vNodes->nCap = iVar5;
  }
LAB_0044f4fe:
  iVar5 = vNodes->nSize;
  vNodes->nSize = iVar5 + 1;
  vNodes->pArray[iVar5] = pNode;
  return;
}

Assistant:

void Sim_SymmsBalanceCollect_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    // if the new node is complemented, another gate begins
    if ( Abc_ObjIsComplement(pNode) )
    {
        Vec_PtrPushUnique( vNodes, pNode );
        return;
    }
    // if pNew is the PI node, return
    if ( Abc_ObjIsCi(pNode) )
    {
        Vec_PtrPushUnique( vNodes, pNode );
        return;    
    }
    // go through the branches
    Sim_SymmsBalanceCollect_rec( Abc_ObjChild0(pNode), vNodes );
    Sim_SymmsBalanceCollect_rec( Abc_ObjChild1(pNode), vNodes );
}